

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<toml::local_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_local_datetime<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::local_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  char cVar3;
  uint16_t uVar4;
  local_date lVar5;
  const_iterator rollback;
  undefined8 uVar6;
  local_date *plVar13;
  region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *prVar14;
  region_base rVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  value_type *pvVar18;
  value_type *pvVar19;
  value_type *pvVar20;
  internal_error *piVar21;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *plVar22;
  _Alloc_hider ctx;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  time;
  result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  date;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inner_loc;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  allocator_type local_2c9;
  undefined1 local_2c8 [32];
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  region<std::vector<char,_std::allocator<char>_>_> local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined8 uStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  char *local_1e8;
  char *pcStack_1e0;
  string local_1d8;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [88];
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  region<std::vector<char,_std::allocator<char>_>_> *local_118;
  undefined1 local_110 [80];
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_78;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined5 uVar9;
  undefined2 uVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_78,
             (sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>>
              *)this,loc);
  if (local_78.is_ok_ == true) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar18 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_158,(detail *)(pvVar18->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar18->last_)._M_current,in_RCX);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&local_c0,&local_1d8,&local_158);
    plVar22 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      plVar22 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      plVar22 = extraout_RDX_01;
    }
    parse_local_date<std::__cxx11::string>
              ((result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_118,(detail *)&local_c0,plVar22);
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_c0;
    if ((local_118._0_1_ != true) ||
       (plVar22 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(((local_c0.source_.
                        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_M_dataplus)._M_p +
                     (local_c0.source_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_M_string_length),
       (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )local_c0.iter_._M_current == plVar22)) {
      piVar21 = (internal_error *)__cxa_allocate_exception(0x28);
      local_230._0_4_ = SUB84((local_date *)&local_220,0);
      local_230._4_2_ = (undefined2)((ulong)&local_220 >> 0x20);
      local_230._6_2_ = (undefined2)((ulong)&local_220 >> 0x30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"[error]: toml::parse_local_datetime: invalid datetime format",
                 "");
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[19],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1b8,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_138,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1b8;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2c8,__l_00,(allocator_type *)&local_2a8);
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)&local_2a0,(string *)local_230,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2c8,&local_248);
      internal_error::internal_error(piVar21,(string *)&local_2a0);
      __cxa_throw(piVar21,&internal_error::typeinfo,internal_error::~internal_error);
    }
    cVar3 = *local_c0.iter_._M_current;
    if (((cVar3 != ' ') && (cVar3 != 'T')) && (cVar3 != 't')) {
      piVar21 = (internal_error *)__cxa_allocate_exception(0x28);
      local_230._0_4_ = SUB84((local_date *)&local_220,0);
      local_230._4_2_ = (undefined2)((ulong)&local_220 >> 0x20);
      local_230._6_2_ = (undefined2)((ulong)&local_220 >> 0x30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"[error]: toml::parse_local_datetime: invalid datetime format",
                 "");
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[29],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1b8,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_138,(char (*) [29])"should be `T` or ` ` (space)");
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_1b8;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2c8,__l_02,(allocator_type *)&local_2a8);
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)&local_2a0,(string *)local_230,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2c8,&local_248);
      internal_error::internal_error(piVar21,(string *)&local_2a0);
      __cxa_throw(piVar21,&internal_error::typeinfo,internal_error::~internal_error);
    }
    cVar3 = *local_c0.iter_._M_current;
    local_c0.iter_._M_current = local_c0.iter_._M_current + 1;
    local_c0.line_number_ = local_c0.line_number_ + (cVar3 == '\n');
    parse_local_time<std::__cxx11::string>
              ((result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,(detail *)&local_c0,plVar22);
    if (local_1b8[0] == false) {
      piVar21 = (internal_error *)__cxa_allocate_exception(0x28);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"[error]: toml::parse_local_datetime: invalid datetime format",
                 "");
      local_2a8 = &local_c0;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[20],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a0,&local_2a8,(char (*) [20])"invalid time fomrat");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_2a0;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_248,__l_01,&local_2c9);
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_230,(string *)local_2c8,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_248,&local_138);
      internal_error::internal_error(piVar21,(string *)local_230);
      __cxa_throw(piVar21,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar19 = result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap((result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_118);
    lVar5 = pvVar19->first;
    pvVar20 = result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap((result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1b8);
    uVar6._0_1_ = (pvVar20->first).hour;
    uVar6._1_1_ = (pvVar20->first).minute;
    uVar7 = (pvVar20->first).second;
    uVar8 = (pvVar20->first).field_0x3;
    uVar10 = (pvVar20->first).millisecond;
    uVar12 = (pvVar20->first).microsecond;
    uVar11 = CONCAT22(uVar12,uVar10);
    uVar9 = CONCAT41(uVar11,uVar8);
    uVar6._2_6_ = CONCAT51(uVar9,uVar7);
    uVar4 = (pvVar20->first).nanosecond;
    pvVar18 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_78);
    local_230._4_2_ = (undefined2)uVar6;
    local_230._6_2_ = (undefined2)uVar6._2_6_;
    local_230._0_4_ = lVar5;
    local_230._8_4_ = uVar11;
    local_230._12_2_ = uVar4;
    region<std::vector<char,_std::allocator<char>_>_>::region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&local_220,pvVar18);
    uVar17 = local_200;
    uVar16 = uStack_210;
    uVar6 = local_220._8_8_;
    local_2a0._M_allocated_capacity._0_6_ = CONCAT24(local_230._4_2_,local_230._0_4_);
    paVar1 = &local_290.source_name_.field_2;
    local_2a0._8_6_ =
         (undefined6)(CONCAT26(local_230._12_2_,CONCAT42(local_230._8_4_,local_230._6_2_)) >> 0x10);
    local_2a0._M_allocated_capacity._6_2_ = local_230._6_2_;
    local_290.super_region_base._vptr_region_base = (_func_int **)&PTR__region_00160ab8;
    local_220._8_8_ = 0;
    uStack_210 = 0;
    if (local_208 == &local_1f8) {
      local_290.source_name_.field_2._8_8_ = local_1f8._8_8_;
      local_290.source_name_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290.source_name_._M_dataplus._M_p = (pointer)local_208;
    }
    local_290.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_1f8._M_allocated_capacity._1_7_;
    local_290.source_name_.field_2._M_local_buf[0] = local_1f8._M_local_buf[0];
    local_200 = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_290.first_._M_current = local_1e8;
    local_290.last_._M_current = pcStack_1e0;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p =
         (pointer)CONCAT26(local_230._6_2_,CONCAT24(local_230._4_2_,local_230._0_4_));
    *(ulong *)((long)&(__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p + 6) =
         CONCAT26(local_230._12_2_,CONCAT42(local_230._8_4_,local_230._6_2_));
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         (size_type)&PTR__region_00160ab8;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = uVar6;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    local_290.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = uVar16;
    local_290.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar2 = (size_type *)((long)&__return_storage_ptr__->field_1 + 0x38);
    *(size_type **)((long)&__return_storage_ptr__->field_1 + 0x28) = psVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.source_name_._M_dataplus._M_p == paVar1) {
      *psVar2 = local_290.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) =
           local_290.source_name_.field_2._8_8_;
    }
    else {
      *(pointer *)((long)&__return_storage_ptr__->field_1 + 0x28) =
           local_290.source_name_._M_dataplus._M_p;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x38) =
           local_290.source_name_.field_2._M_allocated_capacity;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar17;
    local_290.source_name_._M_string_length = 0;
    local_290.source_name_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1f8._M_allocated_capacity._1_7_ << 8;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_1e8;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = pcStack_1e0;
    ctx._M_p = local_290.source_name_._M_dataplus._M_p;
    local_290.source_name_._M_dataplus._M_p = (pointer)paVar1;
    local_208 = &local_1f8;
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_290);
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&local_220);
    result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::local_time,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b8,(EVP_PKEY_CTX *)ctx._M_p);
    result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup((result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_118,(EVP_PKEY_CTX *)ctx._M_p);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&local_c0);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    local_230._0_4_ = SUB84((local_date *)&local_220,0);
    local_230._4_2_ = (undefined2)((ulong)&local_220 >> 0x20);
    local_230._6_2_ = (undefined2)((ulong)&local_220 >> 0x30);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"[error]: toml::parse_local_datetime: ","");
    local_1b8 = (undefined1  [8])this;
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"the next token is not a local_datetime","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_1b8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_c0,__l,(allocator_type *)&local_248);
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    format_underline((string *)&local_2a0,(string *)local_230,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_c0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c8);
    rVar15._vptr_region_base = local_290.super_region_base._vptr_region_base;
    prVar14 = (region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&(((anon_union_80_2_3176b685_for_result<std::pair<toml::local_date,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_3
                            *)local_110)->succ).value + 8);
    local_118 = (region<std::vector<char,_std::allocator<char>_>_> *)
                CONCAT26(local_2a0._M_allocated_capacity._6_2_,local_2a0._M_allocated_capacity._0_6_
                        );
    if (local_118 == &local_290) {
      local_110._16_8_ =
           local_290.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_118 = (region<std::vector<char,_std::allocator<char>_>_> *)prVar14;
    }
    local_2a0._M_allocated_capacity._0_6_ = SUB86(&local_290,0);
    local_2a0._M_allocated_capacity._6_2_ = (undefined2)((ulong)&local_290 >> 0x30);
    local_290.super_region_base._vptr_region_base =
         local_290.super_region_base._vptr_region_base & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_118 == prVar14) {
      paVar1->_M_allocated_capacity = (size_type)rVar15._vptr_region_base;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           local_110._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_118;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
           (size_type)rVar15._vptr_region_base;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length =
         CONCAT26(local_2a0._14_2_,local_2a0._8_6_);
    local_110._8_8_ = (ulong)rVar15._vptr_region_base & 0xffffffffffffff00;
    local_110._0_8_ = (pointer)0x0;
    local_2a0._14_2_ = 0;
    local_2a0._8_6_ = 0;
    local_118 = (region<std::vector<char,_std::allocator<char>_>_> *)prVar14;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    plVar13 = (local_date *)CONCAT26(local_230._6_2_,CONCAT24(local_230._4_2_,local_230._0_4_));
    if (plVar13 != (local_date *)&local_220) {
      operator_delete(plVar13,local_220._M_allocated_capacity + 1);
    }
  }
  if (local_78.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<local_datetime, region<Container>>, std::string>
parse_local_datetime(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_local_date_time::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());
        const auto date = parse_local_date(inner_loc);
        if(!date || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "date, not datetime"}}));
        }
        const char delim = *(inner_loc.iter());
        if(delim != 'T' && delim != 't' && delim != ' ')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "should be `T` or ` ` (space)"}}));
        }
        inner_loc.advance();
        const auto time = parse_local_time(inner_loc);
        if(!time)
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "invalid time fomrat"}}));
        }
        return ok(std::make_pair(
            local_datetime(date.unwrap().first, time.unwrap().first),
            token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("[error]: toml::parse_local_datetime: ",
            {{std::addressof(loc), "the next token is not a local_datetime"}}));
    }
}